

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

DefaultCaseItemSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::DefaultCaseItemSyntax,slang::syntax::DefaultCaseItemSyntax_const&>
          (BumpAllocator *this,DefaultCaseItemSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  Info *pIVar3;
  SyntaxNode *pSVar4;
  TokenKind TVar5;
  undefined1 uVar6;
  NumericTokenFlags NVar7;
  uint32_t uVar8;
  TokenKind TVar9;
  undefined1 uVar10;
  NumericTokenFlags NVar11;
  uint32_t uVar12;
  SyntaxKind SVar13;
  undefined4 uVar14;
  DefaultCaseItemSyntax *pDVar15;
  
  pDVar15 = (DefaultCaseItemSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((DefaultCaseItemSyntax *)this->endPtr < pDVar15 + 1) {
    pDVar15 = (DefaultCaseItemSyntax *)allocateSlow(this,0x40,8);
  }
  else {
    this->head->current = (byte *)(pDVar15 + 1);
  }
  SVar13 = (args->super_CaseItemSyntax).super_SyntaxNode.kind;
  uVar14 = *(undefined4 *)&(args->super_CaseItemSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_CaseItemSyntax).super_SyntaxNode.parent;
  pSVar2 = (args->super_CaseItemSyntax).super_SyntaxNode.previewNode;
  TVar9 = (args->defaultKeyword).kind;
  uVar10 = (args->defaultKeyword).field_0x2;
  NVar11.raw = (args->defaultKeyword).numFlags.raw;
  uVar12 = (args->defaultKeyword).rawLen;
  pIVar3 = (args->defaultKeyword).info;
  TVar5 = (args->colon).kind;
  uVar6 = (args->colon).field_0x2;
  NVar7.raw = (args->colon).numFlags.raw;
  uVar8 = (args->colon).rawLen;
  pSVar4 = (args->clause).ptr;
  (pDVar15->colon).info = (args->colon).info;
  (pDVar15->clause).ptr = pSVar4;
  (pDVar15->defaultKeyword).info = pIVar3;
  (pDVar15->colon).kind = TVar5;
  (pDVar15->colon).field_0x2 = uVar6;
  (pDVar15->colon).numFlags = (NumericTokenFlags)NVar7.raw;
  (pDVar15->colon).rawLen = uVar8;
  (pDVar15->super_CaseItemSyntax).super_SyntaxNode.previewNode = pSVar2;
  (pDVar15->defaultKeyword).kind = TVar9;
  (pDVar15->defaultKeyword).field_0x2 = uVar10;
  (pDVar15->defaultKeyword).numFlags = (NumericTokenFlags)NVar11.raw;
  (pDVar15->defaultKeyword).rawLen = uVar12;
  (pDVar15->super_CaseItemSyntax).super_SyntaxNode.kind = SVar13;
  *(undefined4 *)&(pDVar15->super_CaseItemSyntax).super_SyntaxNode.field_0x4 = uVar14;
  (pDVar15->super_CaseItemSyntax).super_SyntaxNode.parent = pSVar1;
  return pDVar15;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }